

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

bool __thiscall llvm::detail::DoubleAPFloat::bitwiseIsEqual(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  bool bVar1;
  type pAVar2;
  type pAVar3;
  bool local_19;
  DoubleAPFloat *RHS_local;
  DoubleAPFloat *this_local;
  
  pAVar2 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                     (&this->Floats,0);
  pAVar3 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                     (&RHS->Floats,0);
  bVar1 = APFloat::bitwiseIsEqual(pAVar2,pAVar3);
  local_19 = false;
  if (bVar1) {
    pAVar2 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&this->Floats,1);
    pAVar3 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&RHS->Floats,1);
    local_19 = APFloat::bitwiseIsEqual(pAVar2,pAVar3);
  }
  return local_19;
}

Assistant:

bool DoubleAPFloat::bitwiseIsEqual(const DoubleAPFloat &RHS) const {
  return Floats[0].bitwiseIsEqual(RHS.Floats[0]) &&
         Floats[1].bitwiseIsEqual(RHS.Floats[1]);
}